

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void __thiscall despot::Parser::ParseTerminalStateTag(Parser *this,TiXmlHandle *handle)

{
  int iVar1;
  pointer pSVar2;
  TiXmlElement *this_00;
  bool bVar3;
  TiXmlElement *pTVar4;
  TiXmlElement *this_01;
  char *__s;
  long lVar5;
  int i;
  ulong uVar6;
  string name;
  TerminalPattern pattern;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  instance;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  allocator<char> local_132;
  allocator<char> local_131;
  Parser *local_130;
  string local_128;
  vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_> *local_108;
  TiXmlElement *local_100;
  TiXmlElement *local_f8;
  ulong local_f0;
  undefined1 local_e8 [32];
  _Rb_tree_node_base local_c8;
  size_t local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  string local_70;
  string local_50;
  
  local_130 = this;
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)&local_128,(char *)handle);
  util::tinyxml::TiXmlHandle::FirstChild((TiXmlHandle *)local_e8,(char *)&local_128);
  pTVar4 = util::tinyxml::TiXmlHandle::ToElement((TiXmlHandle *)local_e8);
  if (pTVar4 != (TiXmlElement *)0x0) {
    pTVar4 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar4->super_TiXmlNode,"Table");
    local_108 = &local_130->terminal_state_patterns_;
    while (pTVar4 != (TiXmlElement *)0x0) {
      local_e8._16_8_ = (pointer)0x0;
      local_e8._0_8_ = (TiXmlNode *)0x0;
      local_e8._8_8_ = (pointer)0x0;
      local_c8._M_color = _S_red;
      local_c8._M_parent = (_Base_ptr)0x0;
      local_c8._M_left = &local_c8;
      local_a8 = 0;
      local_c8._M_right = local_c8._M_left;
      GetFirstChildText_abi_cxx11_(&local_128,local_130,pTVar4,"Vars");
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70," ",(allocator<char> *)&local_a0);
      Tokenize(&local_88,&local_128,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_128);
      for (uVar6 = 0;
          uVar6 < (ulong)((long)local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)local_88.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5); uVar6 = uVar6 + 1)
      {
        std::__cxx11::string::string
                  ((string *)&local_128,
                   (string *)
                   (local_88.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar6));
        local_70._M_dataplus._M_p._0_4_ = 0;
        while( true ) {
          bVar3 = std::operator!=(&(local_130->curr_state_vars_).
                                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>
                                   ._M_impl.super__Vector_impl_data._M_start
                                   [(int)local_70._M_dataplus._M_p].super_NamedVar.name_,&local_128)
          ;
          if (!bVar3) break;
          local_70._M_dataplus._M_p._0_4_ = (int)local_70._M_dataplus._M_p + 1;
        }
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_e8,(value_type_conflict1 *)&local_70);
        std::__cxx11::string::~string((string *)&local_128);
      }
      this_01 = util::tinyxml::TiXmlNode::FirstChildElement(&pTVar4->super_TiXmlNode,"Instance");
      local_100 = pTVar4;
      while (this_00 = local_100, this_01 != (TiXmlElement *)0x0) {
        __s = util::tinyxml::TiXmlElement::GetText(this_01);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,&local_131);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_70," ",&local_132);
        Tokenize(&local_a0,&local_128,&local_70);
        local_f8 = this_01;
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_128);
        local_128.field_2._M_allocated_capacity = 0;
        local_128._M_dataplus._M_p = (pointer)0x0;
        local_128._M_string_length = 0;
        lVar5 = 0;
        uVar6 = 0;
        while (uVar6 < (ulong)((long)local_a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_a0.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 5)) {
          iVar1 = *(int *)((long)&((TiXmlBase *)local_e8._0_8_)->_vptr_TiXmlBase + uVar6 * 4);
          pSVar2 = (local_130->curr_state_vars_).
                   super__Vector_base<despot::StateVar,_std::allocator<despot::StateVar>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_f0 = uVar6;
          std::__cxx11::string::string
                    ((string *)&local_50,
                     (string *)
                     ((long)&((local_a0.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar5
                     ));
          local_70._M_dataplus._M_p._0_4_ =
               Variable::IndexOf((Variable *)(pSVar2 + iVar1),&local_50);
          std::vector<int,_std::allocator<int>_>::emplace_back<int>
                    ((vector<int,_std::allocator<int>_> *)&local_128,(int *)&local_70);
          std::__cxx11::string::~string((string *)&local_50);
          lVar5 = lVar5 + 0x20;
          uVar6 = local_f0 + 1;
        }
        std::
        _Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
        ::_M_insert_unique<std::vector<int,std::allocator<int>>const&>
                  ((_Rb_tree<std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>,std::_Identity<std::vector<int,std::allocator<int>>>,std::less<std::vector<int,std::allocator<int>>>,std::allocator<std::vector<int,std::allocator<int>>>>
                    *)(local_e8 + 0x18),(vector<int,_std::allocator<int>_> *)&local_128);
        this_01 = util::tinyxml::TiXmlNode::NextSiblingElement(&local_f8->super_TiXmlNode);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&local_128);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
      }
      std::vector<despot::TerminalPattern,_std::allocator<despot::TerminalPattern>_>::push_back
                (local_108,(value_type *)local_e8);
      pTVar4 = util::tinyxml::TiXmlNode::NextSiblingElement(&this_00->super_TiXmlNode);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_88);
      TerminalPattern::~TerminalPattern((TerminalPattern *)local_e8);
    }
  }
  return;
}

Assistant:

void Parser::ParseTerminalStateTag(TiXmlHandle& handle) {
	TiXmlElement* e_Terminal = handle.FirstChild("pomdpx").FirstChild(
		"TerminalState").ToElement();

	if (e_Terminal == NULL)
		return;

	// <Table>
	TiXmlElement* e_Table = GetFirstChildElement(e_Terminal, "Table");
	while (e_Table != NULL) {
		TerminalPattern pattern;
		// <Vars>
		vector<string> names = Tokenize(GetFirstChildText(e_Table, "Vars"));
		for (int i = 0; i < names.size(); i++) {
			string name = names[i];
			int id = 0;
			while (curr_state_vars_[id].name() != name)
				id++;
			pattern.state_ids.push_back(id);
		}

		TiXmlElement* e_Instance = e_Table->FirstChildElement("Instance");
		while (e_Instance != NULL) {
			// <Instance>
			vector<string> instance = Tokenize(e_Instance->GetText());
			vector<int> values;
			for (int i = 0; i < instance.size(); i++) {
				values.push_back(
					curr_state_vars_[pattern.state_ids[i]].IndexOf(
						instance[i]));
			}
			pattern.state_vals.insert(values);

			e_Instance = e_Instance->NextSiblingElement();
		}

		terminal_state_patterns_.push_back(pattern);

		e_Table = e_Table->NextSiblingElement();
	}
}